

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeboneProcess.cpp
# Opt level: O0

void __thiscall Assimp::DeboneProcess::DeboneProcess(DeboneProcess *this)

{
  DeboneProcess *this_local;
  
  BaseProcess::BaseProcess(&this->super_BaseProcess);
  (this->super_BaseProcess)._vptr_BaseProcess = (_func_int **)&PTR__DeboneProcess_00f3f630;
  std::
  vector<std::vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>_>_>
  ::vector(&this->mSubMeshIndices);
  this->mNumBones = 0;
  this->mNumBonesCanDoWithout = 0;
  this->mThreshold = 1.0;
  this->mAllOrNone = false;
  return;
}

Assistant:

DeboneProcess::DeboneProcess()
{
    mNumBones = 0;
    mNumBonesCanDoWithout = 0;

    mThreshold = AI_DEBONE_THRESHOLD;
    mAllOrNone = false;
}